

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

OPJ_FLOAT64 opj_dwt_getnorm(OPJ_UINT32 level,OPJ_UINT32 orient)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 8;
  if (level < 8) {
    uVar1 = level;
  }
  uVar2 = (ulong)uVar1;
  if (orient == 0) {
    uVar2 = (ulong)level;
  }
  uVar3 = 9;
  if (orient != 0) {
    uVar3 = uVar2;
  }
  if (level < 10) {
    uVar3 = uVar2;
  }
  return opj_dwt_norms[orient][uVar3];
}

Assistant:

OPJ_FLOAT64 opj_dwt_getnorm(OPJ_UINT32 level, OPJ_UINT32 orient)
{
    /* FIXME ! This is just a band-aid to avoid a buffer overflow */
    /* but the array should really be extended up to 33 resolution levels */
    /* See https://github.com/uclouvain/openjpeg/issues/493 */
    if (orient == 0 && level >= 10) {
        level = 9;
    } else if (orient > 0 && level >= 9) {
        level = 8;
    }
    return opj_dwt_norms[orient][level];
}